

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvEncode24(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  uint8_t *puVar1;
  int iVar2;
  undefined1 *puVar3;
  uint8_t *local_60;
  uint32_t *tp;
  uint8_t *op;
  tmsize_t occ;
  tmsize_t npixels;
  tmsize_t i;
  LogLuvState *sp;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *bp_local;
  TIFF *tif_local;
  
  puVar1 = tif->tif_data;
  if (s != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x22b,"int LogLuvEncode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  if (puVar1 != (uint8_t *)0x0) {
    npixels = cc / (long)*(int *)(puVar1 + 0xc);
    local_60 = bp;
    if (*(int *)(puVar1 + 4) != 2) {
      local_60 = *(uint8_t **)(puVar1 + 0x10);
      if (*(long *)(puVar1 + 0x18) < npixels) {
        TIFFErrorExtR(tif,"LogLuvEncode24","Translation buffer too short");
        return 0;
      }
      (**(code **)(puVar1 + 0x20))(puVar1,bp,npixels);
    }
    tp = (uint32_t *)tif->tif_rawcp;
    op = (uint8_t *)(tif->tif_rawdatasize - tif->tif_rawcc);
    do {
      if (npixels == 0) {
        tif->tif_rawcp = (uint8_t *)tp;
        tif->tif_rawcc = tif->tif_rawdatasize - (long)op;
        return 1;
      }
      if ((long)op < 3) {
        tif->tif_rawcp = (uint8_t *)tp;
        tif->tif_rawcc = tif->tif_rawdatasize - (long)op;
        iVar2 = TIFFFlushData1(tif);
        if (iVar2 == 0) {
          return 0;
        }
        tp = (uint32_t *)tif->tif_rawcp;
        op = (uint8_t *)(tif->tif_rawdatasize - tif->tif_rawcc);
      }
      *(char *)tp = (char)((uint)*(undefined4 *)local_60 >> 0x10);
      puVar3 = (undefined1 *)((long)tp + 2);
      *(char *)((long)tp + 1) = (char)((uint)*(undefined4 *)local_60 >> 8);
      tp = (uint32_t *)((long)tp + 3);
      *puVar3 = (char)*(undefined4 *)local_60;
      op = op + -3;
      local_60 = local_60 + 4;
      npixels = npixels + -1;
    } while( true );
  }
  __assert_fail("sp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                ,0x22c,"int LogLuvEncode24(TIFF *, uint8_t *, tmsize_t, uint16_t)");
}

Assistant:

static int LogLuvEncode24(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "LogLuvEncode24";
    LogLuvState *sp = EncoderState(tif);
    tmsize_t i;
    tmsize_t npixels;
    tmsize_t occ;
    uint8_t *op;
    uint32_t *tp;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);
    npixels = cc / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_RAW)
        tp = (uint32_t *)bp;
    else
    {
        tp = (uint32_t *)sp->tbuf;
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        (*sp->tfunc)(sp, bp, npixels);
    }
    /* write out encoded pixels */
    op = tif->tif_rawcp;
    occ = tif->tif_rawdatasize - tif->tif_rawcc;
    for (i = npixels; i--;)
    {
        if (occ < 3)
        {
            tif->tif_rawcp = op;
            tif->tif_rawcc = tif->tif_rawdatasize - occ;
            if (!TIFFFlushData1(tif))
                return (0);
            op = tif->tif_rawcp;
            occ = tif->tif_rawdatasize - tif->tif_rawcc;
        }
        *op++ = (uint8_t)(*tp >> 16);
        *op++ = (uint8_t)(*tp >> 8 & 0xff);
        *op++ = (uint8_t)(*tp++ & 0xff);
        occ -= 3;
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = tif->tif_rawdatasize - occ;

    return (1);
}